

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  undefined8 *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  long lVar5;
  int i;
  int i_1;
  long lVar6;
  cpp_dec_float<100U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absdiag;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mindiag;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined1 local_134;
  undefined8 local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxdiag;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_268,0.0,(type *)0x0);
  iVar4 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  if (iVar4 == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_268,1.0);
      lVar5 = 0;
      lVar6 = 0;
      while( true ) {
        iVar4 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar4 <= lVar6) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_268,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar5));
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x50;
      }
      maxdiag.m_backend.data._M_elems[0] = 0;
      maxdiag.m_backend.data._M_elems[1] = 0x3ff00000;
      mindiag.m_backend.fpclass = cpp_dec_float_finite;
      mindiag.m_backend.prec_elem = 0x10;
      mindiag.m_backend.data._M_elems[0] = 0;
      mindiag.m_backend.data._M_elems[1] = 0;
      mindiag.m_backend.data._M_elems[2] = 0;
      mindiag.m_backend.data._M_elems[3] = 0;
      mindiag.m_backend.data._M_elems[4] = 0;
      mindiag.m_backend.data._M_elems[5] = 0;
      mindiag.m_backend.data._M_elems[6] = 0;
      mindiag.m_backend.data._M_elems[7] = 0;
      mindiag.m_backend.data._M_elems[8] = 0;
      mindiag.m_backend.data._M_elems[9] = 0;
      mindiag.m_backend.data._M_elems[10] = 0;
      mindiag.m_backend.data._M_elems[0xb] = 0;
      mindiag.m_backend.data._M_elems[0xc] = 0;
      mindiag.m_backend.data._M_elems[0xd] = 0;
      mindiag.m_backend.data._M_elems._56_5_ = 0;
      mindiag.m_backend.data._M_elems[0xf]._1_3_ = 0;
      mindiag.m_backend.exp = 0;
      mindiag.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&mindiag.m_backend,(double *)&maxdiag,&local_268);
      local_268.data._M_elems[0xf]._1_3_ = mindiag.m_backend.data._M_elems[0xf]._1_3_;
      local_268.data._M_elems._56_5_ = mindiag.m_backend.data._M_elems._56_5_;
      local_268.data._M_elems[0xc] = mindiag.m_backend.data._M_elems[0xc];
      local_268.data._M_elems[0xd] = mindiag.m_backend.data._M_elems[0xd];
      local_268.data._M_elems[8] = mindiag.m_backend.data._M_elems[8];
      local_268.data._M_elems[9] = mindiag.m_backend.data._M_elems[9];
      local_268.data._M_elems[10] = mindiag.m_backend.data._M_elems[10];
      local_268.data._M_elems[0xb] = mindiag.m_backend.data._M_elems[0xb];
      local_268.data._M_elems[4] = mindiag.m_backend.data._M_elems[4];
      local_268.data._M_elems[5] = mindiag.m_backend.data._M_elems[5];
      local_268.data._M_elems[6] = mindiag.m_backend.data._M_elems[6];
      local_268.data._M_elems[7] = mindiag.m_backend.data._M_elems[7];
      local_268.data._M_elems[0] = mindiag.m_backend.data._M_elems[0];
      local_268.data._M_elems[1] = mindiag.m_backend.data._M_elems[1];
      local_268.data._M_elems[2] = mindiag.m_backend.data._M_elems[2];
      local_268.data._M_elems[3] = mindiag.m_backend.data._M_elems[3];
      local_268.exp = mindiag.m_backend.exp;
      local_268.neg = mindiag.m_backend.neg;
      local_268.fpclass = mindiag.m_backend.fpclass;
      local_268.prec_elem = mindiag.m_backend.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_268,0.0);
      lVar5 = 0;
      lVar6 = 0;
      while( true ) {
        iVar4 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar4 <= lVar6) break;
        maxdiag.m_backend.data._M_elems[0] = 0;
        maxdiag.m_backend.data._M_elems[1] = 0x3ff00000;
        mindiag.m_backend.fpclass = cpp_dec_float_finite;
        mindiag.m_backend.prec_elem = 0x10;
        mindiag.m_backend.data._M_elems[0] = 0;
        mindiag.m_backend.data._M_elems[1] = 0;
        mindiag.m_backend.data._M_elems[2] = 0;
        mindiag.m_backend.data._M_elems[3] = 0;
        mindiag.m_backend.data._M_elems[4] = 0;
        mindiag.m_backend.data._M_elems[5] = 0;
        mindiag.m_backend.data._M_elems[6] = 0;
        mindiag.m_backend.data._M_elems[7] = 0;
        mindiag.m_backend.data._M_elems[8] = 0;
        mindiag.m_backend.data._M_elems[9] = 0;
        mindiag.m_backend.data._M_elems[10] = 0;
        mindiag.m_backend.data._M_elems[0xb] = 0;
        mindiag.m_backend.data._M_elems[0xc] = 0;
        mindiag.m_backend.data._M_elems[0xd] = 0;
        mindiag.m_backend.data._M_elems._56_5_ = 0;
        mindiag.m_backend.data._M_elems[0xf]._1_3_ = 0;
        mindiag.m_backend.exp = 0;
        mindiag.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  (&mindiag.m_backend,(double *)&maxdiag,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(((this->
                            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).diag.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar5));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_268,&mindiag.m_backend);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x50;
      }
    }
    else if (type == 0) {
      pnVar2 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
      uStack_80 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2);
      local_78 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4);
      uStack_70 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 6);
      local_68 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8);
      uStack_60 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 10);
      local_58 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 0xc);
      uStack_50 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 0xe);
      local_48 = (pnVar2->m_backend).exp;
      local_44 = (pnVar2->m_backend).neg;
      local_40._0_4_ = (pnVar2->m_backend).fpclass;
      local_40._4_4_ = (pnVar2->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&mindiag,(multiprecision *)&local_88,arg);
      pnVar2 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
      uStack_d0 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2);
      local_c8 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4);
      uStack_c0 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 6);
      local_b8 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8);
      uStack_b0 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 10);
      local_a8 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 0xc);
      uStack_a0 = *(undefined8 *)((pnVar2->m_backend).data._M_elems + 0xe);
      local_98 = (pnVar2->m_backend).exp;
      local_94 = (pnVar2->m_backend).neg;
      local_90._0_4_ = (pnVar2->m_backend).fpclass;
      local_90._4_4_ = (pnVar2->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&maxdiag,(multiprecision *)&local_d8,arg_00);
      lVar5 = 1;
      lVar6 = 0x98;
      while( true ) {
        iVar4 = (*(this->
                  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SLinSolver[4])(this);
        if (iVar4 <= lVar5) break;
        pnVar2 = (this->
                 super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).diag.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x48);
        local_178 = *puVar1;
        uStack_170 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x38);
        local_168 = *puVar1;
        uStack_160 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x28);
        local_158 = *puVar1;
        uStack_150 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -0x18);
        local_148 = *puVar1;
        uStack_140 = puVar1[1];
        local_138 = *(undefined4 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -8);
        local_134 = *(undefined1 *)((long)(pnVar2->m_backend).data._M_elems + lVar6 + -4);
        local_130 = *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + lVar6);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&absdiag,(multiprecision *)&local_178,arg_01);
        tVar3 = boost::multiprecision::operator<(&absdiag,&mindiag);
        b = &mindiag;
        if (tVar3) {
LAB_0030cc60:
          *(undefined8 *)((b->m_backend).data._M_elems + 0xc) =
               absdiag.m_backend.data._M_elems._48_8_;
          *(ulong *)((b->m_backend).data._M_elems + 0xe) =
               CONCAT35(absdiag.m_backend.data._M_elems[0xf]._1_3_,
                        absdiag.m_backend.data._M_elems._56_5_);
          *(undefined8 *)((b->m_backend).data._M_elems + 8) = absdiag.m_backend.data._M_elems._32_8_
          ;
          *(undefined8 *)((b->m_backend).data._M_elems + 10) =
               absdiag.m_backend.data._M_elems._40_8_;
          *(undefined8 *)((b->m_backend).data._M_elems + 4) = absdiag.m_backend.data._M_elems._16_8_
          ;
          *(undefined8 *)((b->m_backend).data._M_elems + 6) = absdiag.m_backend.data._M_elems._24_8_
          ;
          *(undefined8 *)(b->m_backend).data._M_elems = absdiag.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((b->m_backend).data._M_elems + 2) = absdiag.m_backend.data._M_elems._8_8_;
          (b->m_backend).exp = absdiag.m_backend.exp;
          (b->m_backend).neg = absdiag.m_backend.neg;
          (b->m_backend).fpclass = absdiag.m_backend.fpclass;
          (b->m_backend).prec_elem = absdiag.m_backend.prec_elem;
        }
        else {
          b = &maxdiag;
          tVar3 = boost::multiprecision::operator>(&absdiag,b);
          if (tVar3) goto LAB_0030cc60;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x50;
      }
      absdiag.m_backend.fpclass = cpp_dec_float_finite;
      absdiag.m_backend.prec_elem = 0x10;
      absdiag.m_backend.data._M_elems[0] = 0;
      absdiag.m_backend.data._M_elems[1] = 0;
      absdiag.m_backend.data._M_elems[2] = 0;
      absdiag.m_backend.data._M_elems[3] = 0;
      absdiag.m_backend.data._M_elems[4] = 0;
      absdiag.m_backend.data._M_elems[5] = 0;
      absdiag.m_backend.data._M_elems[6] = 0;
      absdiag.m_backend.data._M_elems[7] = 0;
      absdiag.m_backend.data._M_elems[8] = 0;
      absdiag.m_backend.data._M_elems[9] = 0;
      absdiag.m_backend.data._M_elems[10] = 0;
      absdiag.m_backend.data._M_elems[0xb] = 0;
      absdiag.m_backend.data._M_elems[0xc] = 0;
      absdiag.m_backend.data._M_elems[0xd] = 0;
      absdiag.m_backend.data._M_elems._56_5_ = 0;
      absdiag.m_backend.data._M_elems[0xf]._1_3_ = 0;
      absdiag.m_backend.exp = 0;
      absdiag.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&absdiag.m_backend,&maxdiag.m_backend,&mindiag.m_backend);
      local_268.data._M_elems[0xf]._1_3_ = absdiag.m_backend.data._M_elems[0xf]._1_3_;
      local_268.data._M_elems._56_5_ = absdiag.m_backend.data._M_elems._56_5_;
      local_268.data._M_elems[0xc] = absdiag.m_backend.data._M_elems[0xc];
      local_268.data._M_elems[0xd] = absdiag.m_backend.data._M_elems[0xd];
      local_268.data._M_elems[8] = absdiag.m_backend.data._M_elems[8];
      local_268.data._M_elems[9] = absdiag.m_backend.data._M_elems[9];
      local_268.data._M_elems[10] = absdiag.m_backend.data._M_elems[10];
      local_268.data._M_elems[0xb] = absdiag.m_backend.data._M_elems[0xb];
      local_268.data._M_elems[4] = absdiag.m_backend.data._M_elems[4];
      local_268.data._M_elems[5] = absdiag.m_backend.data._M_elems[5];
      local_268.data._M_elems[6] = absdiag.m_backend.data._M_elems[6];
      local_268.data._M_elems[7] = absdiag.m_backend.data._M_elems[7];
      local_268.data._M_elems[0] = absdiag.m_backend.data._M_elems[0];
      local_268.data._M_elems[1] = absdiag.m_backend.data._M_elems[1];
      local_268.data._M_elems[2] = absdiag.m_backend.data._M_elems[2];
      local_268.data._M_elems[3] = absdiag.m_backend.data._M_elems[3];
      local_268.exp = absdiag.m_backend.exp;
      local_268.neg = absdiag.m_backend.neg;
      local_268.fpclass = absdiag.m_backend.fpclass;
      local_268.prec_elem = absdiag.m_backend.prec_elem;
    }
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
         local_268.data._M_elems._48_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
         local_268.data._M_elems._56_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_268.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
         local_268.data._M_elems._40_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_268.data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         local_268.data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_268.data._M_elems._0_8_
    ;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_268.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_268.exp;
    (__return_storage_ptr__->m_backend).neg = local_268.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_268.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_268.prec_elem;
  }
  return __return_storage_ptr__;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}